

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

void __thiscall wasm::Asyncify::addGlobals(Asyncify *this,Module *module,bool imported)

{
  IString str;
  IString str_00;
  Const *pCVar1;
  pointer pGVar2;
  Name name;
  Name name_00;
  Name local_b8;
  uintptr_t local_a8;
  Expression *local_a0;
  char *local_98;
  Type TStack_90;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_80;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> asyncifyData;
  Name local_58;
  Type local_48;
  char *local_40;
  Type local_38;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_30;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> asyncifyState;
  Builder builder;
  bool imported_local;
  Module *module_local;
  Asyncify *this_local;
  
  Builder::Builder((Builder *)&asyncifyState,module);
  local_40 = wasm::(anonymous_namespace)::ASYNCIFY_STATE;
  local_38.id = DAT_027e5080;
  wasm::Type::Type(&local_48,i32);
  pCVar1 = Builder::makeConst<int>((Builder *)&asyncifyState,0);
  name.super_IString.str._M_str = local_40;
  name.super_IString.str._M_len = (size_t)&local_30;
  Builder::makeGlobal(name,local_38,(Expression *)local_48.id,(Mutability)pCVar1);
  if (imported) {
    str_00.str._M_str = (char *)ENV._8_8_;
    str_00.str._M_len = ENV._0_8_;
    wasm::Name::Name(&local_58,str_00);
    pGVar2 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                       (&local_30);
    wasm::Name::operator=(&(pGVar2->super_Importable).module,&local_58);
    pGVar2 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                       (&local_30);
    wasm::Name::operator=
              (&(pGVar2->super_Importable).base,(Name *)&wasm::(anonymous_namespace)::ASYNCIFY_STATE
              );
  }
  Module::addGlobal(module,&local_30);
  local_98 = wasm::(anonymous_namespace)::ASYNCIFY_DATA;
  TStack_90.id = DAT_027e50a0;
  local_a0 = (Expression *)(this->pointerType).id;
  local_a8 = (this->pointerType).id;
  pCVar1 = Builder::makeConst<wasm::Type>((Builder *)&asyncifyState,(Type)local_a8);
  name_00.super_IString.str._M_str = local_98;
  name_00.super_IString.str._M_len = (size_t)&local_80;
  Builder::makeGlobal(name_00,TStack_90,local_a0,(Mutability)pCVar1);
  if (imported) {
    str.str._M_str = (char *)ENV._8_8_;
    str.str._M_len = ENV._0_8_;
    wasm::Name::Name(&local_b8,str);
    pGVar2 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                       (&local_80);
    wasm::Name::operator=(&(pGVar2->super_Importable).module,&local_b8);
    pGVar2 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                       (&local_80);
    wasm::Name::operator=
              (&(pGVar2->super_Importable).base,(Name *)&wasm::(anonymous_namespace)::ASYNCIFY_DATA)
    ;
  }
  Module::addGlobal(module,&local_80);
  std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr(&local_80);
  std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr(&local_30);
  return;
}

Assistant:

void addGlobals(Module* module, bool imported) {
    Builder builder(*module);

    auto asyncifyState = builder.makeGlobal(ASYNCIFY_STATE,
                                            Type::i32,
                                            builder.makeConst(int32_t(0)),
                                            Builder::Mutable);
    if (imported) {
      asyncifyState->module = ENV;
      asyncifyState->base = ASYNCIFY_STATE;
    }
    module->addGlobal(std::move(asyncifyState));

    auto asyncifyData = builder.makeGlobal(ASYNCIFY_DATA,
                                           pointerType,
                                           builder.makeConst(pointerType),
                                           Builder::Mutable);
    if (imported) {
      asyncifyData->module = ENV;
      asyncifyData->base = ASYNCIFY_DATA;
    }
    module->addGlobal(std::move(asyncifyData));
  }